

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O2

UBool __thiscall
icu_63::DateFmtBestPatternKey::operator==(DateFmtBestPatternKey *this,CacheKeyBase *other)

{
  UBool UVar1;
  
  if (this == (DateFmtBestPatternKey *)other) {
    UVar1 = '\x01';
  }
  else {
    UVar1 = LocaleCacheKey<icu_63::DateFmtBestPattern>::operator==
                      (&this->super_LocaleCacheKey<icu_63::DateFmtBestPattern>,other);
    if (UVar1 != '\0') {
      UVar1 = icu_63::UnicodeString::operator==((UnicodeString *)(other + 0xf),&this->fSkeleton);
      return UVar1;
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

virtual UBool operator==(const CacheKeyBase &other) const {
       // reflexive
       if (this == &other) { 	
           return TRUE;
       }
       if (!LocaleCacheKey<DateFmtBestPattern>::operator==(other)) {
           return FALSE;
       }
       // We know that this and other are of same class if we get this far.
       const DateFmtBestPatternKey &realOther =
               static_cast<const DateFmtBestPatternKey &>(other);
       return (realOther.fSkeleton == fSkeleton);
    }